

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_async_notification_event_uninit(ma_async_notification_event *pNotificationEvent)

{
  ma_async_notification_event *pNotificationEvent_local;
  
  if (pNotificationEvent == (ma_async_notification_event *)0x0) {
    pNotificationEvent_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    ma_event_uninit(&pNotificationEvent->e);
    pNotificationEvent_local._4_4_ = MA_SUCCESS;
  }
  return pNotificationEvent_local._4_4_;
}

Assistant:

MA_API ma_result ma_async_notification_event_uninit(ma_async_notification_event* pNotificationEvent)
{
    if (pNotificationEvent == NULL) {
        return MA_INVALID_ARGS;
    }

    #ifndef MA_NO_THREADING
    {
        ma_event_uninit(&pNotificationEvent->e);
        return MA_SUCCESS;
    }
    #else
    {
        return MA_NOT_IMPLEMENTED;  /* Threading is disabled. */
    }
    #endif
}